

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

value * __thiscall mpt::source<double>::value(source<double> *this)

{
  uint uVar1;
  iterator pdVar2;
  value *pvVar3;
  
  if (-1 < this->_pos) {
    pdVar2 = span<const_double>::nth(&this->super_span<const_double>,this->_pos);
    if ((pdVar2 == (iterator)0x0) || (uVar1 = this->_type, 0xffe < uVar1 - 1)) {
      pvVar3 = (value *)0x0;
    }
    else {
      pvVar3 = &this->_val;
      (this->_val)._addr = pdVar2;
      (this->_val)._type = (ulong)uVar1;
    }
    return pvVar3;
  }
  return (value *)0x0;
}

Assistant:

const struct value *value() __MPT_OVERRIDE
	{
		const T *val;
		if (_pos < 0 || !(val = span<const T>::nth(_pos))) {
			return 0;
		}
		return _val.set(_type, val) ? &_val : 0;
	}